

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O1

bool __thiscall pbrt::BVHAggregate::IntersectP(BVHAggregate *this,Ray *ray,Float tMax)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  LinearBVHNode *pLVar6;
  undefined1 auVar7 [16];
  float fVar8;
  ulong uVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  long in_FS_OFFSET;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  float fVar31;
  int nodesToVisit [64];
  undefined8 local_158;
  uint local_150;
  undefined1 local_148 [16];
  anon_union_4_2_72e6e63f_for_LinearBVHNode_1 aaStack_138 [66];
  
  uVar13 = 0;
  if (this->nodes != (LinearBVHNode *)0x0) {
    auVar24._8_4_ = 0x3f800000;
    auVar24._0_8_ = 0x3f8000003f800000;
    auVar24._12_4_ = 0x3f800000;
    uVar2 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar4 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
    auVar28._4_4_ = uVar4;
    auVar28._0_4_ = uVar2;
    auVar28._8_8_ = 0;
    auVar24 = vdivps_avx(auVar24,auVar28);
    auVar30 = ZEXT1664(auVar24);
    fVar31 = 1.0 / (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
    auVar25._0_12_ = ZEXT812(0);
    auVar25._12_4_ = 0;
    uVar19 = vcmpps_avx512vl(auVar24,auVar25,1);
    auVar24 = vcmpps_avx(auVar24,auVar25,1);
    auVar7._8_4_ = 1;
    auVar7._0_8_ = 0x100000001;
    auVar7._12_4_ = 1;
    auVar24 = vandps_avx512vl(auVar24,auVar7);
    bVar23 = (uVar19 & 1) != 0;
    lVar16 = 0;
    if (bVar23) {
      lVar16 = 0xc;
    }
    uVar17 = 0xc;
    if (bVar23) {
      uVar17 = uVar13;
    }
    bVar23 = (uVar19 & 2) != 0;
    lVar18 = 0;
    if (bVar23) {
      lVar18 = 0xc;
    }
    uVar19 = 0xc;
    if (bVar23) {
      uVar19 = uVar13;
    }
    local_158 = vmovlps_avx(auVar24);
    local_150 = (uint)(fVar31 < 0.0);
    lVar20 = 0;
    uVar15 = 0xc;
    if (fVar31 < 0.0) {
      lVar20 = 0xc;
      uVar15 = uVar13;
    }
    uVar14 = 0;
    iVar11 = 0;
    do {
      uVar14 = uVar14 + 1;
      pLVar6 = this->nodes;
      uVar3 = (ray->o).super_Tuple3<pbrt::Point3,_float>.x;
      uVar5 = (ray->o).super_Tuple3<pbrt::Point3,_float>.y;
      auVar26._4_4_ = uVar5;
      auVar26._0_4_ = uVar3;
      auVar26._8_8_ = 0;
      auVar24 = vinsertps_avx(ZEXT416(*(uint *)((long)&pLVar6[iVar11].bounds.pMin.
                                                       super_Tuple3<pbrt::Point3,_float>.x + lVar16)
                                     ),ZEXT416(*(uint *)((long)&pLVar6[iVar11].bounds.pMin.
                                                                super_Tuple3<pbrt::Point3,_float>.y
                                                        + lVar18)),0x10);
      auVar24 = vsubps_avx(auVar24,auVar26);
      auVar29._0_4_ = auVar30._0_4_ * auVar24._0_4_;
      auVar29._4_4_ = auVar30._4_4_ * auVar24._4_4_;
      auVar29._8_4_ = auVar30._8_4_ * auVar24._8_4_;
      auVar29._12_4_ = auVar30._12_4_ * auVar24._12_4_;
      auVar24 = vinsertps_avx(ZEXT416(*(uint *)((long)&pLVar6[iVar11].bounds.pMin.
                                                       super_Tuple3<pbrt::Point3,_float>.x + uVar17)
                                     ),ZEXT416(*(uint *)((long)&pLVar6[iVar11].bounds.pMin.
                                                                super_Tuple3<pbrt::Point3,_float>.y
                                                        + uVar19)),0x10);
      auVar24 = vsubps_avx(auVar24,auVar26);
      auVar27._0_4_ = auVar30._0_4_ * auVar24._0_4_ * 1.0000004;
      auVar27._4_4_ = auVar30._4_4_ * auVar24._4_4_ * 1.0000004;
      auVar27._8_4_ = auVar30._8_4_ * auVar24._8_4_ * 1.0000004;
      auVar27._12_4_ = auVar30._12_4_ * auVar24._12_4_ * 1.0000004;
      auVar24 = vshufps_avx(auVar27,auVar27,0xe1);
      uVar9 = vcmpps_avx512vl(auVar24,auVar29,1);
      iVar12 = (int)uVar13;
      if ((uVar9 & 3) == 0) {
        auVar24 = vmovshdup_avx(auVar29);
        auVar24 = vmaxss_avx(auVar24,auVar29);
        fVar1 = (ray->o).super_Tuple3<pbrt::Point3,_float>.z;
        fVar8 = fVar31 * (*(float *)((long)&pLVar6[iVar11].bounds.pMin.
                                            super_Tuple3<pbrt::Point3,_float>.z + uVar15) - fVar1) *
                1.0000004;
        if (fVar8 < auVar24._0_4_) goto LAB_003f38c7;
        auVar7 = vmovshdup_avx(auVar27);
        auVar7 = vminss_avx(auVar7,auVar27);
        fVar1 = fVar31 * (*(float *)((long)&pLVar6[iVar11].bounds.pMin.
                                            super_Tuple3<pbrt::Point3,_float>.z + lVar20) - fVar1);
        if (((auVar7._0_4_ < fVar1) ||
            (auVar24 = vmaxss_avx(ZEXT416((uint)fVar1),auVar24), tMax <= auVar24._0_4_)) ||
           (auVar24 = vminss_avx(ZEXT416((uint)fVar8),auVar7), auVar24._0_4_ <= 0.0))
        goto LAB_003f38c7;
        if (pLVar6[iVar11].nPrimitives == 0) {
          if (*(int *)((long)&local_158 + (ulong)pLVar6[iVar11].axis * 4) == 0) {
            uVar13 = (ulong)(iVar12 + 1);
            aaStack_138[iVar12] = pLVar6[iVar11].field_1;
            iVar11 = iVar11 + 1;
          }
          else {
            uVar13 = (ulong)(iVar12 + 1);
            aaStack_138[iVar12].primitivesOffset = iVar11 + 1;
            iVar11 = pLVar6[iVar11].field_1.primitivesOffset;
          }
          goto LAB_003f38d8;
        }
        bVar23 = pLVar6[iVar11].nPrimitives != 0;
        iVar22 = 4;
        if (bVar23) {
          local_148 = auVar30._0_16_;
          bVar10 = PrimitiveHandle::IntersectP
                             ((this->primitives).
                              super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                              ._M_impl.super__Vector_impl_data._M_start +
                              pLVar6[iVar11].field_1.primitivesOffset,ray,tMax);
          if (!bVar10) {
            lVar21 = 1;
            do {
              bVar23 = (uint)lVar21 < (uint)pLVar6[iVar11].nPrimitives;
              iVar22 = 4;
              if (!bVar23) goto LAB_003f3a00;
              bVar10 = PrimitiveHandle::IntersectP
                                 ((this->primitives).
                                  super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                                  ._M_impl.super__Vector_impl_data._M_start +
                                  pLVar6[iVar11].field_1.primitivesOffset + lVar21,ray,tMax);
              lVar21 = lVar21 + 1;
            } while (!bVar10);
          }
          *(long *)(in_FS_OFFSET + -0x3f8) = *(long *)(in_FS_OFFSET + -0x3f8) + uVar14;
          iVar22 = 1;
LAB_003f3a00:
          auVar30 = ZEXT1664(local_148);
        }
        if (!bVar23) goto LAB_003f38c7;
      }
      else {
LAB_003f38c7:
        if (iVar12 == 0) {
          iVar22 = 3;
          uVar13 = 0;
        }
        else {
          uVar13 = (ulong)(iVar12 - 1);
          iVar11 = aaStack_138[(long)iVar12 + -1].primitivesOffset;
LAB_003f38d8:
          iVar22 = 0;
        }
      }
    } while (iVar22 == 0);
    if (iVar22 == 3) {
      *(long *)(in_FS_OFFSET + -0x3f8) = *(long *)(in_FS_OFFSET + -0x3f8) + (uVar14 & 0xffffffff);
      uVar13 = 0;
    }
    else {
      uVar13 = 1;
    }
  }
  return SUB81(uVar13,0);
}

Assistant:

bool BVHAggregate::IntersectP(const Ray &ray, Float tMax) const {
    if (nodes == nullptr)
        return false;
    Vector3f invDir(1.f / ray.d.x, 1.f / ray.d.y, 1.f / ray.d.z);
    int dirIsNeg[3] = {static_cast<int>(invDir.x < 0), static_cast<int>(invDir.y < 0),
                       static_cast<int>(invDir.z < 0)};
    int nodesToVisit[64];
    int toVisitOffset = 0, currentNodeIndex = 0;
    int nodesVisited = 0;

    while (true) {
        ++nodesVisited;
        const LinearBVHNode *node = &nodes[currentNodeIndex];
        if (node->bounds.IntersectP(ray.o, ray.d, tMax, invDir, dirIsNeg)) {
            // Process BVH node _node_ for traversal
            if (node->nPrimitives > 0) {
                for (int i = 0; i < node->nPrimitives; ++i) {
                    if (primitives[node->primitivesOffset + i].IntersectP(ray, tMax)) {
                        bvhNodesVisited += nodesVisited;
                        return true;
                    }
                }
                if (toVisitOffset == 0)
                    break;
                currentNodeIndex = nodesToVisit[--toVisitOffset];
            } else {
                if (dirIsNeg[node->axis] != 0) {
                    /// second child first
                    nodesToVisit[toVisitOffset++] = currentNodeIndex + 1;
                    currentNodeIndex = node->secondChildOffset;
                } else {
                    nodesToVisit[toVisitOffset++] = node->secondChildOffset;
                    currentNodeIndex = currentNodeIndex + 1;
                }
            }
        } else {
            if (toVisitOffset == 0)
                break;
            currentNodeIndex = nodesToVisit[--toVisitOffset];
        }
    }
    bvhNodesVisited += nodesVisited;
    return false;
}